

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O2

void __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::calc_price
          (uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *des)

{
  char cVar1;
  __type _Var2;
  istream *piVar3;
  undefined8 *puVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  int b;
  int a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_6c420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_6c418;
  uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *puStack_6c410;
  long lStack_6c408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v1;
  string line;
  string num;
  string line1;
  ifstream file;
  byte abStack_6c368 [488];
  ifstream infile;
  istringstream aiStack_6bf78 [384];
  long arr [235] [235];
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  num._M_dataplus._M_p = (pointer)&num.field_2;
  num._M_string_length = 0;
  num.field_2._M_local_buf[0] = '\0';
  pbStack_6c420 = des;
  pbStack_6c418 = src;
  puStack_6c410 = this;
  std::ifstream::ifstream(&infile,"fare.csv",_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator<<((ostream *)&std::cerr,"Unable to open file");
  }
  else {
    lVar11 = 0;
    while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&infile,(string *)&line),
          ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      uVar13 = line._M_string_length & 0xffffffff;
      uVar7 = (ulong)((int)line._M_string_length - 1);
      uVar9 = 0;
      uVar6 = 0;
      uVar12 = 0;
      lVar10 = lVar11;
      while (uVar13 != uVar9) {
        if ((line._M_dataplus._M_p[uVar9] == ',') || (uVar7 == uVar9)) {
          lStack_6c408 = lVar10;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::append((string *)&num,(ulong)&line,(long)(int)uVar12);
          dVar15 = atof((char *)*puVar4);
          arr[lVar11][uVar6] = (long)dVar15;
          num._M_string_length = 0;
          uVar6 = (ulong)((int)uVar6 + 1);
          bVar14 = uVar7 != uVar9;
          uVar9 = uVar9 + 1;
          *num._M_dataplus._M_p = '\0';
          lVar10 = lStack_6c408;
          if (bVar14) {
            uVar12 = uVar9 & 0xffffffff;
          }
        }
        else {
          uVar9 = uVar9 + 1;
        }
      }
      lVar11 = lVar10 + 1;
    }
    std::ifstream::close();
  }
  line1._M_dataplus._M_p = (pointer)&line1.field_2;
  line1._M_string_length = 0;
  a = 0;
  line1.field_2._M_local_buf[0] = '\0';
  b = 0;
  std::ifstream::ifstream(&file,"stations.txt",_S_in);
  iVar8 = 0;
  do {
    if ((abStack_6c368[*(long *)(_file + -0x18)] & 2) != 0) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&file,(string *)&line1);
    split(&v1,puStack_6c410,&line1,'\t');
    _Var2 = std::operator==(v1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1,pbStack_6c418);
    if (_Var2) {
      std::__cxx11::istringstream::istringstream
                (aiStack_6bf78,
                 (string *)
                 v1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,_S_in);
      std::istream::operator>>((istream *)aiStack_6bf78,&a);
      iVar8 = iVar8 + 1;
      std::__cxx11::istringstream::~istringstream(aiStack_6bf78);
    }
    _Var2 = std::operator==(v1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1,pbStack_6c420);
    if (_Var2) {
      std::__cxx11::istringstream::istringstream
                (aiStack_6bf78,
                 (string *)
                 v1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,_S_in);
      std::istream::operator>>((istream *)aiStack_6bf78,&b);
      iVar8 = iVar8 + 1;
      std::__cxx11::istringstream::~istringstream(aiStack_6bf78);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&v1);
  } while (iVar8 != 2);
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar5,"\t\t\t");
  poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_ebd7);
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::~string((string *)&line1);
  std::ifstream::~ifstream(&infile);
  std::__cxx11::string::~string((string *)&num);
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

void calc_price(ver src, ver des) {
      /*fare calculation and prints fare using fare.csv*/
      string line, num;
      int row = 0, col = 0, k = 0, len = 0, last = 0;
      long arr[235][235];
      ifstream infile("fare.csv");//read fare.csv excel database

      if (infile.is_open()) {
        while (getline(infile, line)) {
          // Takes complete row
          // cout << line<< '\n';
          k = 0, last = 0, col = 0;
          len = line.length();
          while (k != len) {
            if (line[k] == ',' || k == len - 1) {
              //for converting string into number
              arr[row][col] = atof(num.append(line, last, k).c_str());
              //Emptying string for getting next data
              num.clear();

              //increasing column number after saving data
              col++;

              if (k != len - 1)
                last = k + 1;
            }
            k++;
          }
          //increase row number for array
          row++;
        }
        //close the file
        infile.close();
      }
      else cerr << "Unable to open file";
      string line1;
      int a = 0, b = 0, f = 0;
      ifstream file("stations.txt");

      while (!file.eof()) {
        getline(file, line1);
        auto v1 = split(line1, '\t');
        if (v1[1] == src) {
          f++;
          std::istringstream(v1[0]) >> a;
        }
        if (v1[1] == des) {
          f++;
          std::istringstream(v1[0]) >> b;
        }
        if (f == 2) //both src and des covered
          break;
      }
      cout << endl << "\t\t\t";
      cout << "--> Fare is: र" << arr[a - 1][b - 1] << endl;
    }